

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_edit_player_exp(command_conflict *cmd)

{
  _Bool _Var1;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long newv;
  char s [80];
  command_conflict *cmd_local;
  
  if (edit_player_state != EDIT_PLAYER_BREAK) {
    strnfmt((char *)&newv,0x50,"%ld",(long)player->exp);
    _Var1 = get_string("Experience: ",(char *)&newv,0x50);
    if ((_Var1) && (_Var1 = get_long_from_string((char *)&newv,&local_70), _Var1)) {
      if (local_70 < 1) {
        local_78 = 0;
      }
      else {
        local_78 = local_70;
      }
      if (local_78 < 99999999) {
        if (local_70 < 1) {
          local_80 = 0;
        }
        else {
          local_80 = local_70;
        }
        local_88 = local_80;
      }
      else {
        local_88 = 99999999;
      }
      local_70 = local_88;
      if (player->exp < local_88) {
        player_exp_gain(player,(int)local_88 - player->exp);
      }
      else {
        player_exp_lose(player,player->exp - (int)local_88,false);
      }
    }
    else {
      edit_player_state = EDIT_PLAYER_BREAK;
    }
  }
  return;
}

Assistant:

void do_cmd_wiz_edit_player_exp(struct command *cmd)
{
	char s[80];
	long newv;

	if (edit_player_state == EDIT_PLAYER_BREAK) return;

	/* Set default value. */
	strnfmt(s, sizeof(s), "%ld", (long)(player->exp));

	if (!get_string("Experience: ", s, sizeof(s)) ||
			!get_long_from_string(s, &newv)) {
		/* Set next editing stage to break. */
		edit_player_state = EDIT_PLAYER_BREAK;
		return;
	}

	/* Keep in the bounds of [0, PY_MAX_EXP]. */
	newv = MIN(PY_MAX_EXP, MAX(0, newv));

	if (newv > player->exp) {
		player_exp_gain(player, newv - player->exp);
	} else {
		player_exp_lose(player, player->exp - newv, false);
	}
}